

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O3

bool sc_dt::operator==(uint64 u,sc_signed *v)

{
  sc_digit *psVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint64 uVar12;
  bool bVar13;
  sc_digit ud [3];
  uint auStack_1c [3];
  
  if (u == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    uVar12 = u;
    do {
      uVar6 = uVar4;
      uVar4 = uVar6 + 1;
      auStack_1c[uVar6] = (uint)uVar12 & 0x3fffffff;
      if (1 < uVar6) break;
      bVar13 = 0x3fffffff < uVar12;
      uVar12 = uVar12 >> 0x1e;
    } while (bVar13);
    if (1 < uVar6) goto LAB_001d4f9d;
  }
  memset(auStack_1c + (uVar4 & 0xffffffff),0,(ulong)(2 - (int)uVar4) * 4 + 4);
LAB_001d4f9d:
  if (v->sgn == (uint)(u != 0)) {
    uVar7 = v->ndigits;
    psVar1 = v->digit;
    uVar4 = 2;
    uVar5 = 4;
    do {
      if (uVar4 == 0xffffffffffffffff) {
        uVar5 = 0;
        break;
      }
      uVar6 = uVar4 & 0xffffffff;
      uVar4 = uVar4 - 1;
      uVar5 = uVar5 - 1;
    } while (auStack_1c[uVar6] == 0);
    uVar9 = (int)uVar7 >> 0x1f & uVar7;
    uVar10 = uVar7 + 1;
    do {
      uVar11 = uVar9;
      if ((int)uVar7 < 1) break;
      uVar7 = uVar7 - 1;
      uVar10 = uVar10 - 1;
      uVar11 = uVar10;
    } while (psVar1[uVar7] == 0);
    iVar8 = uVar5 - uVar11;
    if (iVar8 == 0) {
      uVar4 = (ulong)uVar5;
      do {
        if ((long)uVar4 < 1) {
          iVar8 = 0;
          goto LAB_001d501f;
        }
        uVar6 = uVar4 - 1;
        lVar3 = uVar4 - 1;
        lVar2 = uVar4 - 1;
        uVar4 = uVar6;
      } while (auStack_1c[lVar3] == psVar1[lVar2]);
      uVar6 = uVar6 & 0xffffffff;
      iVar8 = auStack_1c[uVar6] - psVar1[uVar6];
    }
LAB_001d501f:
    bVar13 = iVar8 == 0;
  }
  else {
    bVar13 = false;
  }
  return bVar13;
}

Assistant:

bool
operator==(uint64 u, const sc_signed& v)
{

  CONVERT_INT64(u);

  if (us != v.sgn)
    return false;

  if (vec_skip_and_cmp(DIGITS_PER_INT64, ud, v.ndigits, v.digit) != 0)
    return false;

  return true;

}